

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void bribe_prog_malaphar(CHAR_DATA *mob,CHAR_DATA *ch,int amount)

{
  int iVar1;
  AFFECT_DATA *arg1;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  AFFECT_DATA *af;
  char *in_stack_00001360;
  CHAR_DATA *in_stack_00001368;
  void *in_stack_ffffffffffffffd8;
  long lVar2;
  undefined4 in_stack_ffffffffffffffe8;
  
  arg1 = affect_find(*(AFFECT_DATA **)(in_RDI + 0x88),(int)gsn_lesser_demon);
  if (arg1 != (AFFECT_DATA *)0x0) {
    if (in_EDX < 10000) {
      do_say(in_stack_00001368,in_stack_00001360);
      do_say(in_stack_00001368,in_stack_00001360);
      act(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),arg1,
          in_stack_ffffffffffffffd8,0);
      *(undefined4 *)(*(long *)(in_RSI + 0xc0) + 0xd20) = 0xffffffff;
    }
    else {
      act(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),arg1,
          in_stack_ffffffffffffffd8,0);
      send_to_char(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
      *(undefined4 *)(*(long *)(in_RSI + 0xc0) + 0xd20) = 2;
      lVar2 = *(long *)(in_RSI + 0xc0);
      iVar1 = skill_lookup((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
      *(undefined2 *)(lVar2 + 1000 + (long)iVar1 * 2) = 1;
    }
  }
  return;
}

Assistant:

void bribe_prog_malaphar(CHAR_DATA *mob, CHAR_DATA *ch, int amount)
{
	AFFECT_DATA *af = affect_find(mob->affected, gsn_lesser_demon);

	if (!af)
		return;

	if (amount < 10000)
	{
		do_say(mob, "Surely, friend, you do not believe me to be a pauper?");
		do_say(mob, "Entirely unacceptable, I'm afraid.");

		act("$n wraps his cloak around him and vanishes into the shadows.", ch, 0, 0, TO_ROOM);
		ch->pcdata->lesserdata[LESSER_MALAPHAR] = FAVOR_FAILED;
		return;
	}

	act("A thin smile crosses Malaphar's face as he tips his hat to you and vanishes.", ch, 0, 0, TO_ROOM);
	send_to_char("A wave of greed flashes over you as your fingers seem somehow more nimble.\n\r", ch);

	ch->pcdata->lesserdata[LESSER_MALAPHAR] = FAVOR_GRANTED;
	ch->pcdata->learned[skill_lookup("steal")] = 1;
}